

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O0

Class * __thiscall cppgenerate::Class::setIsQObject(Class *this,bool isQObject)

{
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [39];
  byte local_11;
  Class *pCStack_10;
  bool isQObject_local;
  Class *this_local;
  
  local_11 = isQObject;
  if (isQObject) {
    pCStack_10 = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"QObject",&local_39);
    addSystemInclude(this,(string *)local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"QObject",&local_71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"",&local_99);
    addParentClass(this,(string *)local_70,PUBLIC,(string *)local_98);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  this->m_isQobject = (bool)(local_11 & 1);
  return this;
}

Assistant:

Class& Class::setIsQObject( const bool isQObject ){
    if( isQObject ){
        addSystemInclude( "QObject" );
        addParentClass( "QObject", cppgenerate::AccessModifier::PUBLIC );
    }

    m_isQobject = isQObject;

    return *this;
}